

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O3

void cmsysProcess_SetPipeNative(cmsysProcess *cp,int prPipe,int *p)

{
  uint uVar1;
  ulong uVar2;
  
  if (cp != (cmsysProcess *)0x0) {
    uVar1 = prPipe - 1;
    if (uVar1 < 3) {
      uVar2 = (ulong)uVar1;
      if (p == (int *)0x0) {
        (cp->PipeNativeSTDIN + uVar2 * 2)[0] = -1;
        (cp->PipeNativeSTDIN + uVar2 * 2)[1] = -1;
      }
      else {
        cp->PipeNativeSTDIN[uVar2 * 2] = *p;
        cp->PipeNativeSTDIN[uVar2 * 2 + 1] = p[1];
        if (*(void **)(cp->PipeNativeSTDIN + (ulong)uVar1 * 2 + -9) != (void *)0x0) {
          free(*(void **)(cp->PipeNativeSTDIN + (ulong)uVar1 * 2 + -9));
          (cp->PipeNativeSTDIN + (ulong)uVar1 * 2 + -9)[0] = 0;
          (cp->PipeNativeSTDIN + (ulong)uVar1 * 2 + -9)[1] = 0;
        }
        if (prPipe == 3) {
          cp->PipeSharedSTDERR = 0;
        }
        else if (prPipe == 2) {
          cp->PipeSharedSTDOUT = 0;
        }
        else {
          cp->PipeSharedSTDIN = 0;
        }
      }
    }
  }
  return;
}

Assistant:

void kwsysProcess_SetPipeNative(kwsysProcess* cp, int prPipe, const int p[2])
{
  int* pPipeNative = 0;

  if (!cp) {
    return;
  }

  switch (prPipe) {
    case kwsysProcess_Pipe_STDIN:
      pPipeNative = cp->PipeNativeSTDIN;
      break;
    case kwsysProcess_Pipe_STDOUT:
      pPipeNative = cp->PipeNativeSTDOUT;
      break;
    case kwsysProcess_Pipe_STDERR:
      pPipeNative = cp->PipeNativeSTDERR;
      break;
    default:
      return;
  }

  /* Copy the native pipe descriptors provided.  */
  if (p) {
    pPipeNative[0] = p[0];
    pPipeNative[1] = p[1];
  } else {
    pPipeNative[0] = -1;
    pPipeNative[1] = -1;
  }

  /* If we are using a native pipe, do not share it or redirect it to
     a file.  */
  if (p) {
    kwsysProcess_SetPipeFile(cp, prPipe, 0);
    kwsysProcess_SetPipeShared(cp, prPipe, 0);
  }
}